

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t Variant_calcSizeBinary(UA_Variant *src,UA_DataType *_)

{
  byte bVar1;
  ushort uVar2;
  UA_DataType *pUVar3;
  size_t sVar4;
  long lVar5;
  byte bVar6;
  size_t sVar7;
  UA_DataType *__00;
  size_t sVar8;
  void *pvVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auStack_58 [8];
  UA_NodeId typeId;
  
  pUVar3 = src->type;
  if (pUVar3 == (UA_DataType *)0x0) {
    sVar8 = 1;
  }
  else {
    if ((src->arrayLength == 0) && ((void *)0x1 < src->data)) {
      bVar6 = 0;
      bVar11 = false;
    }
    else {
      bVar11 = src->arrayDimensionsSize != 0;
      bVar6 = 1;
    }
    bVar1 = pUVar3->field_0x25;
    auStack_58._0_2_ = 0;
    auStack_58._2_2_ = 0;
    auStack_58._4_4_ = UA_NODEIDTYPE_NUMERIC;
    typeId.namespaceIndex = 0;
    typeId._2_2_ = 0;
    typeId.identifierType = UA_NODEIDTYPE_NUMERIC;
    typeId.identifier.string.length = 0;
    if ((bVar1 & 1) == 0) {
      auStack_58._0_2_ = (pUVar3->typeId).namespaceIndex;
      auStack_58._2_2_ = *(undefined2 *)&(pUVar3->typeId).field_0x2;
      auStack_58._4_4_ = (pUVar3->typeId).identifierType;
      typeId._0_8_ = (pUVar3->typeId).identifier.string.length;
      typeId.identifier.string.length = (size_t)(pUVar3->typeId).identifier.string.data;
      if (auStack_58._4_4_ != UA_NODEIDTYPE_NUMERIC) {
        return 0;
      }
      __00 = (UA_DataType *)0x19;
    }
    else {
      __00 = (UA_DataType *)(ulong)pUVar3->typeIndex;
    }
    sVar8 = (ulong)bVar6 * 4 + 1;
    sVar7 = 1;
    if (bVar6 != 0) {
      sVar7 = src->arrayLength;
    }
    pvVar9 = src->data;
    uVar2 = pUVar3->memSize;
    typeId.identifier.string.data = (UA_Byte *)__00;
    while (bVar10 = sVar7 != 0, sVar7 = sVar7 - 1, bVar10) {
      if ((bVar1 & 1) == 0) {
        sVar4 = NodeId_calcSizeBinary((UA_NodeId *)auStack_58,__00);
        sVar8 = sVar8 + sVar4 + 5;
      }
      __00 = src->type;
      lVar5 = (*(code *)(&calcSizeBinaryJumpTable)[(long)typeId.identifier.guid.data4])(pvVar9);
      sVar8 = sVar8 + lVar5;
      pvVar9 = (void *)((long)pvVar9 + (ulong)uVar2);
    }
    if (bVar11) {
      sVar7 = Array_calcSizeBinary(src->arrayDimensions,src->arrayDimensionsSize,UA_TYPES + 5);
      sVar8 = sVar8 + sVar7;
    }
  }
  return sVar8;
}

Assistant:

static size_t
Variant_calcSizeBinary(UA_Variant const *src, UA_DataType *_) {
    size_t s = 1; /* encoding byte */
    if(!src->type)
        return s;

    UA_Boolean isArray = src->arrayLength > 0 || src->data <= UA_EMPTY_ARRAY_SENTINEL;
    UA_Boolean hasDimensions = isArray && src->arrayDimensionsSize > 0;
    UA_Boolean isBuiltin = src->type->builtin;

    UA_NodeId typeId;
    UA_NodeId_init(&typeId);
    size_t encode_index = src->type->typeIndex;
    if(!isBuiltin) {
        encode_index = UA_BUILTIN_TYPES_COUNT;
        typeId = src->type->typeId;
        if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
            return 0;
    }

    size_t length = src->arrayLength;
    if(isArray)
        s += 4;
    else
        length = 1;

    uintptr_t ptr = (uintptr_t)src->data;
    size_t memSize = src->type->memSize;
    for(size_t i = 0; i < length; ++i) {
        if(!isBuiltin) {
            /* The type is wrapped inside an extensionobject */
            s += NodeId_calcSizeBinary(&typeId, NULL);
            s += 1 + 4; // encoding byte + length
        }
        s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, src->type);
        ptr += memSize;
    }

    if(hasDimensions)
        s += Array_calcSizeBinary(src->arrayDimensions, src->arrayDimensionsSize,
                                  &UA_TYPES[UA_TYPES_INT32]);
    return s;
}